

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O0

ssize_t ws_enc_write_head(Curl_easy *data,ws_encoder *enc,uint flags,curl_off_t payload_len,
                         bufq *out,CURLcode *err)

{
  uchar uVar1;
  byte bVar2;
  ssize_t n;
  size_t hlen;
  uchar head [14];
  uchar opcode;
  uchar firstbyte;
  CURLcode *err_local;
  bufq *out_local;
  curl_off_t payload_len_local;
  uint flags_local;
  ws_encoder *enc_local;
  Curl_easy *data_local;
  
  head[7] = '\0';
  unique0x100001bf = err;
  if (payload_len < 0) {
    Curl_failf(data,"WS: starting new frame with negative payload length %ld",payload_len);
    *stack0xffffffffffffffc0 = CURLE_SEND_ERROR;
    data_local = (Curl_easy *)0xffffffffffffffff;
  }
  else if (enc->payload_remain < 1) {
    head[6] = ws_frame_flags2op(flags & 0xfffffffb);
    if (head[6] == 0) {
      Curl_failf(data,"WS: provided flags not recognized \'%x\'",(ulong)flags);
      *stack0xffffffffffffffc0 = CURLE_SEND_ERROR;
      data_local = (Curl_easy *)0xffffffffffffffff;
    }
    else {
      if ((flags & 4) == 0) {
        if ((enc->contfragment & 1U) == 0) {
          head[7] = head[7] | head[6] | 0x80;
        }
        else {
          head[7] = head[7] | 0x80;
        }
        enc->contfragment = false;
      }
      else if ((enc->contfragment & 1U) == 0) {
        enc->contfragment = true;
        head[7] = head[6];
      }
      enc->firstbyte = head[7];
      hlen._0_1_ = head[7];
      bVar2 = (byte)payload_len;
      uVar1 = (uchar)((ulong)payload_len >> 8);
      if (payload_len < 0x10000) {
        if (payload_len < 0x7e) {
          hlen._1_1_ = bVar2 | 0x80;
          n = 2;
        }
        else {
          hlen._1_1_ = 0xfe;
          n = 4;
          hlen._2_1_ = uVar1;
          hlen._3_1_ = bVar2;
        }
      }
      else {
        hlen._1_1_ = 0xff;
        hlen._4_1_ = (undefined1)((ulong)payload_len >> 0x28);
        hlen._5_1_ = (undefined1)((ulong)payload_len >> 0x20);
        hlen._6_1_ = (undefined1)((ulong)payload_len >> 0x18);
        hlen._7_1_ = (undefined1)((ulong)payload_len >> 0x10);
        n = 10;
        hlen._2_1_ = (uchar)((ulong)payload_len >> 0x38);
        hlen._3_1_ = (byte)((ulong)payload_len >> 0x30);
        head[0] = uVar1;
        head[1] = bVar2;
      }
      enc->payload_len = payload_len;
      enc->payload_remain = payload_len;
      ws_enc_info(enc,data,"sending");
      *(undefined4 *)(head + n + -8) = *(undefined4 *)enc->mask;
      enc->xori = 0;
      data_local = (Curl_easy *)Curl_bufq_write(out,(uchar *)&hlen,n + 4U,stack0xffffffffffffffc0);
      if ((long)data_local < 0) {
        data_local = (Curl_easy *)0xffffffffffffffff;
      }
      else if (data_local != (Curl_easy *)(n + 4U)) {
        *stack0xffffffffffffffc0 = CURLE_SEND_ERROR;
        data_local = (Curl_easy *)0xffffffffffffffff;
      }
    }
  }
  else {
    Curl_failf(data,"WS: starting new frame with %zd bytes from last one remaining to be sent",
               enc->payload_remain);
    *stack0xffffffffffffffc0 = CURLE_SEND_ERROR;
    data_local = (Curl_easy *)0xffffffffffffffff;
  }
  return (ssize_t)data_local;
}

Assistant:

static ssize_t ws_enc_write_head(struct Curl_easy *data,
                                 struct ws_encoder *enc,
                                 unsigned int flags,
                                 curl_off_t payload_len,
                                 struct bufq *out,
                                 CURLcode *err)
{
  unsigned char firstbyte = 0;
  unsigned char opcode;
  unsigned char head[14];
  size_t hlen;
  ssize_t n;

  if(payload_len < 0) {
    failf(data, "WS: starting new frame with negative payload length %"
                FMT_OFF_T, payload_len);
    *err = CURLE_SEND_ERROR;
    return -1;
  }

  if(enc->payload_remain > 0) {
    /* trying to write a new frame before the previous one is finished */
    failf(data, "WS: starting new frame with %zd bytes from last one "
                "remaining to be sent", (ssize_t)enc->payload_remain);
    *err = CURLE_SEND_ERROR;
    return -1;
  }

  opcode = ws_frame_flags2op((int)flags & ~CURLWS_CONT);
  if(!opcode) {
    failf(data, "WS: provided flags not recognized '%x'", flags);
    *err = CURLE_SEND_ERROR;
    return -1;
  }

  if(!(flags & CURLWS_CONT)) {
    if(!enc->contfragment)
      /* not marked as continuing, this is the final fragment */
      firstbyte |= WSBIT_FIN | opcode;
    else
      /* marked as continuing, this is the final fragment; set CONT
         opcode and FIN bit */
      firstbyte |= WSBIT_FIN | WSBIT_OPCODE_CONT;

    enc->contfragment = FALSE;
  }
  else if(enc->contfragment) {
    /* the previous fragment was not a final one and this is not either, keep a
       CONT opcode and no FIN bit */
    firstbyte |= WSBIT_OPCODE_CONT;
  }
  else {
    firstbyte = opcode;
    enc->contfragment = TRUE;
  }

  head[0] = enc->firstbyte = firstbyte;
  if(payload_len > 65535) {
    head[1] = 127 | WSBIT_MASK;
    head[2] = (unsigned char)((payload_len >> 56) & 0xff);
    head[3] = (unsigned char)((payload_len >> 48) & 0xff);
    head[4] = (unsigned char)((payload_len >> 40) & 0xff);
    head[5] = (unsigned char)((payload_len >> 32) & 0xff);
    head[6] = (unsigned char)((payload_len >> 24) & 0xff);
    head[7] = (unsigned char)((payload_len >> 16) & 0xff);
    head[8] = (unsigned char)((payload_len >> 8) & 0xff);
    head[9] = (unsigned char)(payload_len & 0xff);
    hlen = 10;
  }
  else if(payload_len >= 126) {
    head[1] = 126 | WSBIT_MASK;
    head[2] = (unsigned char)((payload_len >> 8) & 0xff);
    head[3] = (unsigned char)(payload_len & 0xff);
    hlen = 4;
  }
  else {
    head[1] = (unsigned char)payload_len | WSBIT_MASK;
    hlen = 2;
  }

  enc->payload_remain = enc->payload_len = payload_len;
  ws_enc_info(enc, data, "sending");

  /* add 4 bytes mask */
  memcpy(&head[hlen], &enc->mask, 4);
  hlen += 4;
  /* reset for payload to come */
  enc->xori = 0;

  n = Curl_bufq_write(out, head, hlen, err);
  if(n < 0)
    return -1;
  if((size_t)n != hlen) {
    /* We use a bufq with SOFT_LIMIT, writing should always succeed */
    DEBUGASSERT(0);
    *err = CURLE_SEND_ERROR;
    return -1;
  }
  return n;
}